

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::doTraverseSchema(TraverseSchema *this,DOMElement *schemaRoot)

{
  SchemaElementDecl *elemDecl;
  bool bVar1;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar2;
  SchemaElementDecl *pSVar3;
  SchemaElementDecl **ppSVar4;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *this_00;
  XMLSize_t XVar5;
  DOMElement **ppDVar6;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *this_01;
  ulong local_48;
  XMLSize_t j;
  XMLSize_t icNodesSize;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *icNodes;
  SchemaElementDecl *curElem;
  XMLSize_t i;
  XMLSize_t icListSize;
  DOMElement *schemaRoot_local;
  TraverseSchema *this_local;
  
  processChildren(this,schemaRoot);
  if ((this->fIC_ElementsNS !=
       (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        *)0x0) &&
     (bVar1 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              ::containsKey(this->fIC_ElementsNS,this->fTargetNSURIString), bVar1)) {
    pVVar2 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fIC_ElementsNS,this->fTargetNSURIString);
    this->fIC_Elements = pVVar2;
    pSVar3 = (SchemaElementDecl *)
             ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::size(this->fIC_Elements);
    for (curElem = (SchemaElementDecl *)0x0; curElem < pSVar3;
        curElem = (SchemaElementDecl *)
                  ((long)&(curElem->super_XMLElementDecl).super_XSerializable._vptr_XSerializable +
                  1)) {
      ppSVar4 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt
                          (this->fIC_Elements,(XMLSize_t)curElem);
      elemDecl = *ppSVar4;
      this_00 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
                ::get(this->fIC_NodeListNS,elemDecl);
      XVar5 = ValueVectorOf<xercesc_4_0::DOMElement_*>::size(this_00);
      for (local_48 = 0; local_48 < XVar5; local_48 = local_48 + 1) {
        ppDVar6 = ValueVectorOf<xercesc_4_0::DOMElement_*>::elementAt(this_00,local_48);
        traverseKeyRef(this,*ppDVar6,elemDecl);
      }
    }
  }
  bVar1 = XMLScanner::getValidateAnnotations(this->fScanner);
  if (bVar1) {
    this_01 = SchemaGrammar::getAnnotations(this->fSchemaGrammar);
    bVar1 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::isEmpty(this_01);
    if (!bVar1) {
      validateAnnotations(this);
    }
  }
  SchemaInfo::setProcessed(this->fSchemaInfo,true);
  return;
}

Assistant:

void TraverseSchema::doTraverseSchema(const DOMElement* const schemaRoot) {

    // process children nodes
    processChildren(schemaRoot);

    // Handle identity constraints - keyref
    if (fIC_ElementsNS && fIC_ElementsNS->containsKey(fTargetNSURIString)) {

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);

        XMLSize_t icListSize = fIC_Elements->size();

        for (XMLSize_t i=0; i < icListSize; i++) {

            SchemaElementDecl* curElem = fIC_Elements->elementAt(i);
            ValueVectorOf<DOMElement*>* icNodes =  fIC_NodeListNS->get(curElem);
            XMLSize_t icNodesSize = icNodes->size();

            for (XMLSize_t j = 0; j < icNodesSize; j++) {
                traverseKeyRef(icNodes->elementAt(j), curElem);
            }
        }
    }

    if (fScanner->getValidateAnnotations() && !fSchemaGrammar->getAnnotations()->isEmpty())
    {
        validateAnnotations();
    }
    fSchemaInfo->setProcessed();
}